

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

bsc_group_t bsc_group_create_partition(uint color)

{
  uint uVar1;
  uint uVar2;
  void *addr;
  group_t *g;
  int iVar3;
  ulong uVar4;
  bsp_size_t bVar5;
  bsp_pid_t members;
  bsp_size_t bVar6;
  uint pid;
  bool bVar7;
  uint color_local;
  ulong local_38;
  
  color_local = color;
  uVar1 = bsp_nprocs();
  uVar2 = bsp_pid();
  addr = calloc((long)(int)uVar1,4);
  g = (group_t *)calloc(1,0x20);
  if (addr == (void *)0x0 || g == (group_t *)0x0) {
    bsp_abort("bsc_group_create_partition: Insufficient memory");
  }
  bsp_push_reg(addr,uVar1 * 4);
  bsp_sync();
  pid = 0;
  local_38 = (ulong)uVar2;
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  for (; uVar1 != pid; pid = pid + 1) {
    bsp_put(pid,&color_local,addr,uVar2 * 4,4);
  }
  bsp_sync();
  members = 0;
  bVar5 = 0;
  for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
    bVar6 = bVar5;
    if ((local_38 & 0xffffffff) == uVar4) {
      bVar6 = members;
    }
    bVar7 = *(uint *)((long)addr + uVar4 * 4) == color_local;
    if (bVar7) {
      bVar5 = bVar6;
    }
    members = members + (uint)bVar7;
  }
  group_create(g,members);
  iVar3 = 0;
  for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
    if (*(uint *)((long)addr + uVar4 * 4) == color_local) {
      g->lid[uVar4] = iVar3;
      g->rof[iVar3] = bVar5;
      g->gid[iVar3] = (bsp_pid_t)uVar4;
      iVar3 = iVar3 + 1;
    }
    else {
      g->lid[uVar4] = -1;
    }
  }
  bsp_pop_reg(addr);
  bsp_sync();
  free(addr);
  return g;
}

Assistant:

bsc_group_t bsc_group_create_partition( unsigned color )
{
    bsp_pid_t i, j, P = bsp_nprocs(), s = bsp_pid();
    bsp_pid_t n_members = 0;
    bsp_pid_t rof = 0;
    unsigned * all_colors = calloc( P, sizeof(all_colors[0]) );
    group_t * g = calloc( 1, sizeof(*g) );
    if (!all_colors || !g)
        bsp_abort("bsc_group_create_partition: Insufficient memory");
    bsp_push_reg( all_colors, P * sizeof(all_colors[0]) );
    bsp_sync();

    /* all-gather the colors */
    for ( i = 0 ; i < P; ++i ) {
        bsp_put( i, &color, all_colors, sizeof(all_colors[0])*s,
                sizeof(all_colors[0]) );
    }
    bsp_sync();

    /* count number of members */
    for ( i = 0; i < P; ++i )
        if ( all_colors[i] == color ) {
            if (i == s ) rof = n_members;
            n_members += 1;
        }

    group_create( g, n_members );
    j = 0;
    for ( i = 0; i < P; ++i )
        if ( all_colors[i] == color ) {
            g->lid[ i ] = j;
            g->rof[ j ] = rof;
            g->gid[ j ] = i;
            j++;
        }
        else {
            g->lid[i] = -1;
        }

    bsp_pop_reg(all_colors);
    bsp_sync();
    free(all_colors);

    return g;
}